

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proctitle.c
# Opt level: O3

char ** uv_setup_args(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char **ppcVar5;
  int local_54;
  char **ppcStack_50;
  int i;
  char *s;
  size_t size;
  char **new_argv;
  uv__process_title pt;
  char **argv_local;
  char **ppcStack_10;
  int argc_local;
  
  ppcStack_10 = argv;
  if (0 < argc) {
    pcVar1 = *argv;
    sVar3 = strlen(*argv);
    s = (char *)(sVar3 + 1);
    for (local_54 = 1; local_54 < argc; local_54 = local_54 + 1) {
      sVar4 = strlen(argv[local_54]);
      s = s + sVar4 + 1;
    }
    ppcVar5 = (char **)uv__malloc((size_t)(s + (long)(argc + 1) * 8));
    if (ppcVar5 != (char **)0x0) {
      local_54 = 0;
      ppcStack_50 = ppcVar5 + (argc + 1);
      s = (char *)(sVar3 + 1);
      while( true ) {
        memcpy(ppcStack_50,argv[local_54],(size_t)s);
        ppcVar5[local_54] = (char *)ppcStack_50;
        ppcStack_50 = (char **)(s + (long)ppcStack_50);
        iVar2 = local_54 + 1;
        if (argc <= iVar2) break;
        sVar4 = strlen(argv[iVar2]);
        s = (char *)(sVar4 + 1);
        local_54 = iVar2;
      }
      ppcVar5[iVar2] = (char *)0x0;
      process_title.cap = (long)(argv[local_54] + (long)s) - (long)*argv;
      args_mem = ppcVar5;
      process_title.str = pcVar1;
      process_title.len = sVar3;
      ppcStack_10 = ppcVar5;
    }
  }
  return ppcStack_10;
}

Assistant:

char** uv_setup_args(int argc, char** argv) {
  struct uv__process_title pt;
  char** new_argv;
  size_t size;
  char* s;
  int i;

  if (argc <= 0)
    return argv;

  pt.str = argv[0];
  pt.len = strlen(argv[0]);
  pt.cap = pt.len + 1;

  /* Calculate how much memory we need for the argv strings. */
  size = pt.cap;
  for (i = 1; i < argc; i++)
    size += strlen(argv[i]) + 1;

  /* Add space for the argv pointers. */
  size += (argc + 1) * sizeof(char*);

  new_argv = uv__malloc(size);
  if (new_argv == NULL)
    return argv;

  /* Copy over the strings and set up the pointer table. */
  i = 0;
  s = (char*) &new_argv[argc + 1];
  size = pt.cap;
  goto loop;

  for (/* empty */; i < argc; i++) {
    size = strlen(argv[i]) + 1;
  loop:
    memcpy(s, argv[i], size);
    new_argv[i] = s;
    s += size;
  }
  new_argv[i] = NULL;

  pt.cap = argv[i - 1] + size - argv[0];

  args_mem = new_argv;
  process_title = pt;

  return new_argv;
}